

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
goodform::array_validator::for_each
          (array_validator *this,function<void_(goodform::sub_form_&,_unsigned_long)> *fn)

{
  any *paVar1;
  any *paVar2;
  const_reference v;
  undefined1 local_30 [8];
  sub_form tmp;
  size_t i;
  function<void_(goodform::sub_form_&,_unsigned_long)> *fn_local;
  array_validator *this_local;
  
  tmp.variant_ = (any *)0x0;
  while( true ) {
    paVar1 = tmp.variant_;
    paVar2 = (any *)std::vector<std::any,_std::allocator<std::any>_>::size(this->value_);
    if (paVar2 <= paVar1) break;
    v = std::vector<std::any,_std::allocator<std::any>_>::operator[]
                  (this->value_,(size_type)tmp.variant_);
    sub_form::sub_form((sub_form *)local_30,v,this->error_);
    std::function<void_(goodform::sub_form_&,_unsigned_long)>::operator()
              (fn,(sub_form *)local_30,(unsigned_long)tmp.variant_);
    tmp.variant_ = (any *)((long)&(tmp.variant_)->_M_manager + 1);
  }
  return;
}

Assistant:

void array_validator::for_each(const std::function<void(sub_form& element, size_t index)>& fn)
  {
    for (size_t i = 0; i < this->value_.size(); ++i)
    {
      sub_form tmp(this->value_[i], this->error_);
      fn(tmp, i);
    }
  }